

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatred.cpp
# Opt level: O0

void __thiscall
TPZMatRed<std::complex<long_double>,_TPZFMatrix<std::complex<long_double>_>_>::K11Reduced
          (TPZMatRed<std::complex<long_double>,_TPZFMatrix<std::complex<long_double>_>_> *this,
          TPZFMatrix<std::complex<long_double>_> *K11,TPZFMatrix<std::complex<long_double>_> *F1)

{
  TPZMatrixSolver<std::complex<long_double>_> *pTVar1;
  size_type sVar2;
  ostream *poVar3;
  void *this_00;
  long in_RDI;
  TPZStepSolver<std::complex<long_double>_> *step;
  int in_stack_00000134;
  TPZFMatrix<std::complex<long_double>_> *in_stack_00000138;
  TPZFMatrix<std::complex<long_double>_> *in_stack_00000140;
  TPZFMatrix<std::complex<long_double>_> *in_stack_00000148;
  TPZFMatrix<std::complex<long_double>_> *in_stack_00000150;
  undefined1 in_stack_00000160 [32];
  undefined1 in_stack_00000180 [32];
  undefined2 in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff22;
  TPZMatRed<std::complex<long_double>,_TPZFMatrix<std::complex<long_double>_>_> *local_80;
  complex<long_double> local_68;
  complex<long_double> local_48;
  TPZFMatrix<std::complex<long_double>_> *in_stack_ffffffffffffffd8;
  TPZMatRed<std::complex<long_double>,_TPZFMatrix<std::complex<long_double>_>_>
  *in_stack_ffffffffffffffe0;
  
  if ((*(byte *)(in_RDI + 0x311) & 1) == 0) {
    DecomposeK00((TPZMatRed<std::complex<long_double>,_TPZFMatrix<std::complex<long_double>_>_> *)F1
                );
    SimetrizeMatRed((TPZMatRed<std::complex<long_double>,_TPZFMatrix<std::complex<long_double>_>_> *
                    )CONCAT62(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20));
    pTVar1 = TPZAutoPointer<TPZMatrixSolver<std::complex<long_double>_>_>::operator->
                       ((TPZAutoPointer<TPZMatrixSolver<std::complex<long_double>_>_> *)
                        (in_RDI + 0x28));
    (*(pTVar1->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])
              (pTVar1,in_RDI + 0xc0,in_RDI + 0xc0,0);
    pTVar1 = TPZAutoPointer<TPZMatrixSolver<std::complex<long_double>_>_>::operator->
                       ((TPZAutoPointer<TPZMatrixSolver<std::complex<long_double>_>_> *)
                        (in_RDI + 0x28));
    if (pTVar1 == (TPZMatrixSolver<std::complex<long_double>_> *)0x0) {
      local_80 = (TPZMatRed<std::complex<long_double>,_TPZFMatrix<std::complex<long_double>_>_> *)
                 0x0;
    }
    else {
      local_80 = (TPZMatRed<std::complex<long_double>,_TPZFMatrix<std::complex<long_double>_>_> *)
                 __dynamic_cast(pTVar1,&TPZMatrixSolver<std::complex<long_double>>::typeinfo,
                                &TPZStepSolver<std::complex<long_double>>::typeinfo,0);
    }
    TPZStepSolver<std::complex<long_double>>::Singular_abi_cxx11_
              ((TPZStepSolver<std::complex<long_double>> *)local_80);
    sVar2 = std::__cxx11::list<long,_std::allocator<long>_>::size
                      ((list<long,_std::allocator<long>_> *)
                       CONCAT62(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20));
    if (sVar2 != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Address ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_80);
      poVar3 = std::operator<<(poVar3," Number of singular modes ");
      TPZStepSolver<std::complex<long_double>>::Singular_abi_cxx11_
                ((TPZStepSolver<std::complex<long_double>> *)local_80);
      sVar2 = std::__cxx11::list<long,_std::allocator<long>_>::size
                        ((list<long,_std::allocator<long>_> *)
                         CONCAT62(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20));
      this_00 = (void *)std::ostream::operator<<(poVar3,sVar2);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    *(undefined1 *)(in_RDI + 0x311) = 1;
    in_stack_ffffffffffffffe0 = local_80;
  }
  std::complex<long_double>::complex(&local_48,-(longdouble)1,(longdouble)0);
  std::complex<long_double>::complex(&local_68,(longdouble)1,(longdouble)0);
  TPZFMatrix<std::complex<long_double>_>::MultAdd
            (in_stack_00000150,in_stack_00000148,in_stack_00000140,in_stack_00000138,
             (complex<long_double>)in_stack_00000160,(complex<long_double>)in_stack_00000180,
             in_stack_00000134);
  F1Red(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void TPZMatRed<TVar,TSideMatrix>::K11Reduced(TPZFMatrix<TVar> &K11, TPZFMatrix<TVar> &F1)
{
	
	if(!fK01IsComputed)
	{
        DecomposeK00();
		SimetrizeMatRed();
		fSolver->Solve(fK01,fK01);
        TPZStepSolver<TVar> *step = dynamic_cast<TPZStepSolver<TVar> *>(fSolver.operator->());
        if (step->Singular().size())
        {
            std::cout << "Address " << (void *) step << " Number of singular modes " << step->Singular().size() << std::endl;
        }
		fK01IsComputed = true;
	}
	fK10.MultAdd(fK01,fK11,(K11),-1.,1.);
    F1Red(F1);

	return;
}